

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O2

void soplex::SPxShellsort<int,soplex::Compare<double>>
               (int *keys,int end,Compare<double> *compare,int start)

{
  int iVar1;
  double *pdVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  double *pdVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  
  for (uVar8 = 2; -1 < (int)uVar8; uVar8 = uVar8 - 1) {
    iVar4 = SPxShellsort<int,_soplex::Compare<double>_>::incs[uVar8];
    iVar7 = start;
    for (lVar9 = (long)(iVar4 + start); lVar9 <= end; lVar9 = lVar9 + 1) {
      iVar5 = keys[lVar9];
      pdVar6 = compare->weight;
      iVar10 = iVar7;
      while ((iVar1 = iVar4 + iVar10, iVar4 + start <= iVar1 &&
             (dVar3 = pdVar6[keys[iVar10]], pdVar2 = pdVar6 + iVar5,
             *pdVar2 <= dVar3 && dVar3 != *pdVar2))) {
        keys[iVar1] = keys[iVar10];
        iVar10 = iVar10 - iVar4;
      }
      keys[iVar1] = iVar5;
      iVar7 = iVar7 + 1;
    }
  }
  return;
}

Assistant:

void SPxShellsort(T* keys, int end, COMPARATOR& compare, int start = 0)
{
   static const int incs[3] = {1, 5, 19}; /* sequence of increments */
   int k;

   assert(start <= end);

   for(k = 2; k >= 0; --k)
   {
      int h = incs[k];
      int first = h + start;
      int i;

      for(i = first; i <= end; ++i)
      {
         int j;
         T tempkey = keys[i];

         j = i;

         while(j >= first && compare(tempkey, keys[j - h]) < 0)
         {
            keys[j] = keys[j - h];
            j -= h;
         }

         keys[j] = tempkey;
      }
   }
}